

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::clear(clusterizer<crnlib::vec<6U,_float>_> *this)

{
  pair<crnlib::vec<6U,_float>,_unsigned_int> *p;
  vec<6U,_float> *p_00;
  void *p_01;
  ulong uVar1;
  long lVar2;
  vq_node *p_02;
  
  p = (this->m_training_vecs).m_p;
  if (p != (pair<crnlib::vec<6U,_float>,_unsigned_int> *)0x0) {
    crnlib_free(p);
    (this->m_training_vecs).m_p = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)0x0;
    (this->m_training_vecs).m_size = 0;
    (this->m_training_vecs).m_capacity = 0;
  }
  p_00 = (this->m_codebook).m_p;
  if (p_00 != (vec<6U,_float> *)0x0) {
    crnlib_free(p_00);
    (this->m_codebook).m_p = (vec<6U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  p_02 = (this->m_nodes).m_p;
  if (p_02 != (vq_node *)0x0) {
    uVar1 = (ulong)(this->m_nodes).m_size;
    if (uVar1 != 0) {
      lVar2 = 0;
      do {
        p_01 = *(void **)((long)(&p_02->m_centroid + 1) + lVar2 + 0x10);
        if (p_01 != (void *)0x0) {
          crnlib_free(p_01);
        }
        lVar2 = lVar2 + 0x48;
      } while (uVar1 * 0x48 != lVar2);
      p_02 = (this->m_nodes).m_p;
    }
    crnlib_free(p_02);
    (this->m_nodes).m_p = (vq_node *)0x0;
    (this->m_nodes).m_size = 0;
    (this->m_nodes).m_capacity = 0;
  }
  this->m_overall_variance = 0.0;
  this->m_split_index = 0;
  this->m_heap_size = 0;
  this->m_quick = false;
  return;
}

Assistant:

void clear()
        {
            m_training_vecs.clear();
            m_codebook.clear();
            m_nodes.clear();
            m_overall_variance = 0.0f;
            m_split_index = 0;
            m_heap_size = 0;
            m_quick = false;
        }